

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsLinuxELFObjdumpGetRuntimeDependenciesTool.cxx
# Opt level: O2

bool __thiscall
cmBinUtilsLinuxELFObjdumpGetRuntimeDependenciesTool::GetFileInfo
          (cmBinUtilsLinuxELFObjdumpGetRuntimeDependenciesTool *this,string *file,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *needed,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *rpaths,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *runpaths)

{
  cmRuntimeDependencyArchive *this_00;
  pointer ppSVar1;
  bool bVar2;
  int iVar3;
  istream *piVar4;
  ostream *poVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rpath;
  value_type *pvVar6;
  cmUVProcessChain process;
  vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_> status
  ;
  string line;
  string local_228;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  cmUVProcessChainBuilder builder;
  ostringstream e;
  
  cmUVProcessChainBuilder::cmUVProcessChainBuilder(&builder);
  cmUVProcessChainBuilder::SetBuiltinStream(&builder,Stream_OUTPUT);
  command.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  command.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  command.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (this->super_cmBinUtilsLinuxELFGetRuntimeDependenciesTool).Archive;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"objdump",(allocator<char> *)&line);
  bVar2 = cmRuntimeDependencyArchive::GetGetRuntimeDependenciesCommand
                    (this_00,(string *)&e,&command);
  std::__cxx11::string::~string((string *)&e);
  if (bVar2) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&command,
               (char (*) [3])"-p");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&command,file);
    cmUVProcessChainBuilder::AddCommand(&builder,&command);
    cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)&process);
    bVar2 = cmUVProcessChain::Valid(&process);
    if (bVar2) {
      line._M_dataplus._M_p = (pointer)&line.field_2;
      line._M_string_length = 0;
      line.field_2._M_local_buf[0] = '\0';
      if (GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
          ::neededRegex == '\0') {
        iVar3 = __cxa_guard_acquire(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                     ::neededRegex);
        if (iVar3 != 0) {
          cmsys::RegularExpression::RegularExpression
                    (&GetFileInfo::neededRegex,"^ *NEEDED *([^\n]*)$");
          __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetFileInfo::neededRegex,
                       &__dso_handle);
          __cxa_guard_release(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                               ::neededRegex);
        }
      }
      if (GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
          ::rpathRegex == '\0') {
        iVar3 = __cxa_guard_acquire(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                     ::rpathRegex);
        if (iVar3 != 0) {
          cmsys::RegularExpression::RegularExpression
                    (&GetFileInfo::rpathRegex,"^ *RPATH *([^\n]*)$");
          __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetFileInfo::rpathRegex,
                       &__dso_handle);
          __cxa_guard_release(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                               ::rpathRegex);
        }
      }
      if (GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
          ::runpathRegex == '\0') {
        iVar3 = __cxa_guard_acquire(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                     ::runpathRegex);
        if (iVar3 != 0) {
          cmsys::RegularExpression::RegularExpression
                    (&GetFileInfo::runpathRegex,"^ *RUNPATH *([^\n]*)$");
          __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetFileInfo::runpathRegex,
                       &__dso_handle);
          __cxa_guard_release(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                               ::runpathRegex);
        }
      }
LAB_003e48e6:
      while( true ) {
        piVar4 = cmUVProcessChain::OutputStream(&process);
        piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           (piVar4,(string *)&line);
        if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
        memset((RegularExpressionMatch *)&e,0,0xa8);
        bVar2 = cmsys::RegularExpression::find
                          (&GetFileInfo::neededRegex,line._M_dataplus._M_p,
                           (RegularExpressionMatch *)&e);
        if (!bVar2) {
          bVar2 = cmsys::RegularExpression::find
                            (&GetFileInfo::rpathRegex,line._M_dataplus._M_p,
                             (RegularExpressionMatch *)&e);
          if (!bVar2) goto LAB_003e49e6;
          cmsys::RegularExpressionMatch::match_abi_cxx11_(&local_228,(RegularExpressionMatch *)&e,1)
          ;
          cmsys::SystemTools::SplitString
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&status,&local_228,':',false);
          std::__cxx11::string::~string((string *)&local_228);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::reserve(rpaths,((long)status.
                                  super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)status.
                                  super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5) +
                           ((long)(rpaths->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(rpaths->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start >> 5));
          ppSVar1 = status.
                    super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (pvVar6 = (value_type *)
                        status.
                        super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; pvVar6 != (value_type *)ppSVar1;
              pvVar6 = pvVar6 + 1) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(rpaths,pvVar6);
          }
          goto LAB_003e4a6e;
        }
        cmsys::RegularExpressionMatch::match_abi_cxx11_(&local_228,(RegularExpressionMatch *)&e,1);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)needed,
                   &local_228);
        std::__cxx11::string::~string((string *)&local_228);
      }
      bVar2 = cmUVProcessChain::Wait(&process,-1);
      if (bVar2) {
        cmUVProcessChain::GetStatus(&status,&process);
        if ((*status.
              super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
              ._M_impl.super__Vector_impl_data._M_start == (Status *)0x0) ||
           ((*status.
              super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
              ._M_impl.super__Vector_impl_data._M_start)->ExitStatus != 0)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar5 = std::operator<<((ostream *)&e,"Failed to run objdump on:\n  ");
          std::operator<<(poVar5,(string *)file);
          std::__cxx11::stringbuf::str();
          cmBinUtilsLinuxELFGetRuntimeDependenciesTool::SetError
                    (&this->super_cmBinUtilsLinuxELFGetRuntimeDependenciesTool,&local_228);
          std::__cxx11::string::~string((string *)&local_228);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
          bVar2 = false;
        }
        else {
          bVar2 = true;
        }
        std::
        _Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
        ::~_Vector_base(&status.
                         super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                       );
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar5 = std::operator<<((ostream *)&e,"Failed to wait on objdump process for:\n  ");
        std::operator<<(poVar5,(string *)file);
        std::__cxx11::stringbuf::str();
        cmBinUtilsLinuxELFGetRuntimeDependenciesTool::SetError
                  (&this->super_cmBinUtilsLinuxELFGetRuntimeDependenciesTool,&local_228);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        bVar2 = false;
      }
      std::__cxx11::string::~string((string *)&line);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar5 = std::operator<<((ostream *)&e,"Failed to start objdump process for:\n  ");
      std::operator<<(poVar5,(string *)file);
      std::__cxx11::stringbuf::str();
      cmBinUtilsLinuxELFGetRuntimeDependenciesTool::SetError
                (&this->super_cmBinUtilsLinuxELFGetRuntimeDependenciesTool,&line);
      std::__cxx11::string::~string((string *)&line);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      bVar2 = false;
    }
    cmUVProcessChain::~cmUVProcessChain(&process);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"Could not find objdump",(allocator<char> *)&line);
    cmBinUtilsLinuxELFGetRuntimeDependenciesTool::SetError
              (&this->super_cmBinUtilsLinuxELFGetRuntimeDependenciesTool,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    bVar2 = false;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&command);
  std::
  vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
  ::~vector(&builder.Processes);
  return bVar2;
LAB_003e49e6:
  bVar2 = cmsys::RegularExpression::find
                    (&GetFileInfo::runpathRegex,line._M_dataplus._M_p,(RegularExpressionMatch *)&e);
  if (bVar2) {
    cmsys::RegularExpressionMatch::match_abi_cxx11_(&local_228,(RegularExpressionMatch *)&e,1);
    cmsys::SystemTools::SplitString
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&status,&local_228,':',false);
    std::__cxx11::string::~string((string *)&local_228);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(runpaths,((long)status.
                              super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)status.
                              super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5) +
                       ((long)(runpaths->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(runpaths->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5));
    ppSVar1 = status.
              super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (pvVar6 = (value_type *)
                  status.
                  super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; pvVar6 != (value_type *)ppSVar1;
        pvVar6 = pvVar6 + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(runpaths,pvVar6);
    }
LAB_003e4a6e:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&status);
  }
  goto LAB_003e48e6;
}

Assistant:

bool cmBinUtilsLinuxELFObjdumpGetRuntimeDependenciesTool::GetFileInfo(
  std::string const& file, std::vector<std::string>& needed,
  std::vector<std::string>& rpaths, std::vector<std::string>& runpaths)
{
  cmUVProcessChainBuilder builder;
  builder.SetBuiltinStream(cmUVProcessChainBuilder::Stream_OUTPUT);

  std::vector<std::string> command;
  if (!this->Archive->GetGetRuntimeDependenciesCommand("objdump", command)) {
    this->SetError("Could not find objdump");
    return false;
  }
  command.emplace_back("-p");
  command.push_back(file);
  builder.AddCommand(command);

  auto process = builder.Start();
  if (!process.Valid()) {
    std::ostringstream e;
    e << "Failed to start objdump process for:\n  " << file;
    this->SetError(e.str());
    return false;
  }

  std::string line;
  static const cmsys::RegularExpression neededRegex("^ *NEEDED *([^\n]*)$");
  static const cmsys::RegularExpression rpathRegex("^ *RPATH *([^\n]*)$");
  static const cmsys::RegularExpression runpathRegex("^ *RUNPATH *([^\n]*)$");
  while (std::getline(*process.OutputStream(), line)) {
    cmsys::RegularExpressionMatch match;
    if (neededRegex.find(line.c_str(), match)) {
      needed.push_back(match.match(1));
    } else if (rpathRegex.find(line.c_str(), match)) {
      std::vector<std::string> rpathSplit =
        cmSystemTools::SplitString(match.match(1), ':');
      rpaths.reserve(rpaths.size() + rpathSplit.size());
      for (auto const& rpath : rpathSplit) {
        rpaths.push_back(rpath);
      }
    } else if (runpathRegex.find(line.c_str(), match)) {
      std::vector<std::string> runpathSplit =
        cmSystemTools::SplitString(match.match(1), ':');
      runpaths.reserve(runpaths.size() + runpathSplit.size());
      for (auto const& runpath : runpathSplit) {
        runpaths.push_back(runpath);
      }
    }
  }

  if (!process.Wait()) {
    std::ostringstream e;
    e << "Failed to wait on objdump process for:\n  " << file;
    this->SetError(e.str());
    return false;
  }
  auto status = process.GetStatus();
  if (!status[0] || status[0]->ExitStatus != 0) {
    std::ostringstream e;
    e << "Failed to run objdump on:\n  " << file;
    this->SetError(e.str());
    return false;
  }

  return true;
}